

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

void __thiscall
cmFindBaseDebugState::cmFindBaseDebugState
          (cmFindBaseDebugState *this,string *commandName,cmFindBase *findBase)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->FindCommand = findBase;
  paVar1 = &(this->CommandName).field_2;
  (this->CommandName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (commandName->_M_dataplus)._M_p;
  paVar2 = &commandName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&commandName->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->CommandName).field_2 + 8) = uVar4;
  }
  else {
    (this->CommandName)._M_dataplus._M_p = pcVar3;
    (this->CommandName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->CommandName)._M_string_length = commandName->_M_string_length;
  (commandName->_M_dataplus)._M_p = (pointer)paVar2;
  commandName->_M_string_length = 0;
  (commandName->field_2)._M_local_buf[0] = '\0';
  (this->FailedSearchLocations).
  super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FailedSearchLocations).
  super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FailedSearchLocations).
  super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FoundSearchLocation).regexName._M_dataplus._M_p =
       (pointer)&(this->FoundSearchLocation).regexName.field_2;
  (this->FoundSearchLocation).regexName._M_string_length = 0;
  (this->FoundSearchLocation).regexName.field_2._M_local_buf[0] = '\0';
  (this->FoundSearchLocation).path._M_dataplus._M_p =
       (pointer)&(this->FoundSearchLocation).path.field_2;
  (this->FoundSearchLocation).path._M_string_length = 0;
  (this->FoundSearchLocation).path.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmFindBaseDebugState::cmFindBaseDebugState(std::string commandName,
                                           cmFindBase const* findBase)
  : FindCommand(findBase)
  , CommandName(std::move(commandName))
{
}